

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_search_resp(connectdata *conn,int imapcode,imapstate instate)

{
  char *__s;
  size_t sVar1;
  size_t len;
  char *line;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  line._4_4_ = CURLE_OK;
  __s = (conn->data->state).buffer;
  sVar1 = strlen(__s);
  if (imapcode == 0x2a) {
    __s[sVar1] = '\n';
    line._4_4_ = Curl_client_write(conn,1,__s,sVar1 + 1);
    __s[sVar1] = '\0';
  }
  else if (imapcode == 0x4f) {
    state(conn,IMAP_STOP);
  }
  else {
    line._4_4_ = CURLE_QUOTE_ERROR;
  }
  return line._4_4_;
}

Assistant:

static CURLcode imap_state_search_resp(struct connectdata *conn, int imapcode,
                                       imapstate instate)
{
  CURLcode result = CURLE_OK;
  char *line = conn->data->state.buffer;
  size_t len = strlen(line);

  (void)instate; /* No use for this yet */

  if(imapcode == '*') {
    /* Temporarily add the LF character back and send as body to the client */
    line[len] = '\n';
    result = Curl_client_write(conn, CLIENTWRITE_BODY, line, len + 1);
    line[len] = '\0';
  }
  else if(imapcode != 'O')
    result = CURLE_QUOTE_ERROR; /* TODO: Fix error code */
  else
    /* End of DO phase */
    state(conn, IMAP_STOP);

  return result;
}